

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9PrintTruth(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGVar1;
  bool bVar2;
  int iVar3;
  uint iPo;
  int iVar4;
  char *pcVar5;
  int iVar6;
  word Truth;
  word local_38;
  
  iPo = 0;
  Extra_UtilGetoptReset();
  iVar4 = -1;
  bVar2 = false;
  do {
    while( true ) {
      while (iVar3 = Extra_UtilGetopt(argc,argv,"ORvh"), iVar6 = globalUtilOptind, iVar3 == 0x76) {
        bVar2 = (bool)(bVar2 ^ 1);
      }
      if (iVar3 == -1) {
        pGVar1 = pAbc->pGia;
        if (pGVar1 == (Gia_Man_t *)0x0) {
          pcVar5 = "Abc_CommandAbc9PrintTruth(): There is no AIG.\n";
        }
        else if (pGVar1->vCis->nSize - pGVar1->nRegs < 7) {
          iVar6 = pGVar1->vCos->nSize;
          if ((int)(iVar4 + iPo) <= iVar6 - pGVar1->nRegs) {
            if (iVar4 != -1) {
              iVar6 = iVar4;
            }
            if (0 < iVar6) {
              iVar6 = iVar6 + iPo;
              do {
                local_38 = Gia_LutComputeTruth6Simple(pAbc->pGia,iPo);
                printf("Output %8d : ",(ulong)iPo);
                Extra_PrintHex(_stdout,(uint *)&local_38,pAbc->pGia->vCis->nSize);
                putchar(10);
                iPo = iPo + 1;
              } while ((int)iPo < iVar6);
              return 0;
            }
            return 0;
          }
          pcVar5 = "Abc_CommandAbc9PrintTruth(): Range of outputs to extract is incorrect.\n";
        }
        else {
          pcVar5 = "The number of inputs of the AIG exceeds 6.\n";
        }
        iVar4 = -1;
        goto LAB_0026fd16;
      }
      if (iVar3 == 0x52) break;
      if (iVar3 != 0x4f) goto LAB_0026fc94;
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-O\" should be followed by an integer.\n";
LAB_0026fc88:
        Abc_Print(-1,pcVar5);
        goto LAB_0026fc94;
      }
      iPo = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar6 + 1;
      if ((int)iPo < 0) goto LAB_0026fc94;
    }
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-R\" should be followed by an integer.\n";
      goto LAB_0026fc88;
    }
    iVar4 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar6 + 1;
  } while (-1 < iVar4);
LAB_0026fc94:
  Abc_Print(-2,"usage: &print_truth [-OR num] [-vh]\n");
  Abc_Print(-2,"\t         prints truth tables of outputs in hex notation\n");
  Abc_Print(-2,"\t-O num : the index of first PO to print [default = %d]\n",(ulong)iPo);
  Abc_Print(-2,"\t-R num : (optional) the number of outputs to extract [default = all]\n");
  pcVar5 = "yes";
  if (!bVar2) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
  pcVar5 = "\t-h     : print the command usage\n";
  iVar4 = -2;
LAB_0026fd16:
  Abc_Print(iVar4,pcVar5);
  return 1;
}

Assistant:

int Abc_CommandAbc9PrintTruth( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern word Gia_LutComputeTruth6Simple( Gia_Man_t * p, int iPo );
    int i, c, iOutNum = 0, nOutRange = -1, fVerbose = 0; word Truth;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ORvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            iOutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iOutNum < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            nOutRange = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nOutRange < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9PrintTruth(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManPiNum(pAbc->pGia) > 6 )
    {
        Abc_Print( -1, "The number of inputs of the AIG exceeds 6.\n" );
        return 1;
    }
    if ( iOutNum < 0 || iOutNum + nOutRange > Gia_ManPoNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9PrintTruth(): Range of outputs to extract is incorrect.\n" );
        return 1;
    }
    if ( nOutRange == -1 )
        nOutRange = Gia_ManCoNum(pAbc->pGia);
    for ( i = iOutNum; i < iOutNum + nOutRange; i++ )
    {
        Truth = Gia_LutComputeTruth6Simple( pAbc->pGia, i );
        printf( "Output %8d : ", i );
        Extra_PrintHex( stdout, (unsigned *)&Truth, Gia_ManCiNum(pAbc->pGia) );
        printf( "\n" );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &print_truth [-OR num] [-vh]\n" );
    Abc_Print( -2, "\t         prints truth tables of outputs in hex notation\n" );
    Abc_Print( -2, "\t-O num : the index of first PO to print [default = %d]\n", iOutNum );
    Abc_Print( -2, "\t-R num : (optional) the number of outputs to extract [default = all]\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}